

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kat.cpp
# Opt level: O0

void kat::DoKatSort(vector<_IO_FILE_*,_std::allocator<_IO_FILE_*>_> *inFiles)

{
  bool bVar1;
  bool bVar2;
  reference pp_Var3;
  size_type sVar4;
  size_type sVar5;
  _func_void_map<kat::period_event,_kat::fin_data,_std::less<kat::period_event>,_std::allocator<std::pair<const_kat::period_event,_kat::fin_data>_>_>_ptr_fin_data_ptr
  *local_10d0;
  _func_void_map<kat::period_event,_kat::fin_data,_std::less<kat::period_event>,_std::allocator<std::pair<const_kat::period_event,_kat::fin_data>_>_>_ptr_fin_data_ptr
  *GetPLTRow;
  _func_void_map<int,_kat::fin_data,_std::less<int>,_std::allocator<std::pair<const_int,_kat::fin_data>_>_>_ptr_fin_data_ptr
  *GetELTRow;
  undefined1 local_10b8 [4];
  int offset;
  float val;
  char *local_10a8;
  char *data;
  int inArgs;
  int argCheck;
  fin_data row;
  __normal_iterator<_IO_FILE_**,_std::vector<_IO_FILE_*,_std::allocator<_IO_FILE_*>_>_> local_88;
  iterator it;
  int qpltMELTCheck;
  int qpltMELTMask;
  undefined1 local_70 [3];
  bool legacyFiles;
  int expectedNArgs;
  map<kat::period_event,_kat::fin_data,_std::less<kat::period_event>,_std::allocator<std::pair<const_kat::period_event,_kat::fin_data>_>_>
  data_plt;
  map<int,_kat::fin_data,_std::less<int>,_std::allocator<std::pair<const_int,_kat::fin_data>_>_>
  data_elt;
  vector<_IO_FILE_*,_std::allocator<_IO_FILE_*>_> *inFiles_local;
  
  std::
  map<int,_kat::fin_data,_std::less<int>,_std::allocator<std::pair<const_int,_kat::fin_data>_>_>::
  map((map<int,_kat::fin_data,_std::less<int>,_std::allocator<std::pair<const_int,_kat::fin_data>_>_>
       *)&data_plt._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::
  map<kat::period_event,_kat::fin_data,_std::less<kat::period_event>,_std::allocator<std::pair<const_kat::period_event,_kat::fin_data>_>_>
  ::map((map<kat::period_event,_kat::fin_data,_std::less<kat::period_event>,_std::allocator<std::pair<const_kat::period_event,_kat::fin_data>_>_>
         *)local_70);
  qpltMELTMask = 0;
  bVar1 = false;
  it._M_current._4_4_ = 3;
  it._M_current._0_4_ = 0;
  local_88._M_current =
       (_IO_FILE **)std::vector<_IO_FILE_*,_std::allocator<_IO_FILE_*>_>::begin(inFiles);
LAB_001027f7:
  row.data._4088_8_ = std::vector<_IO_FILE_*,_std::allocator<_IO_FILE_*>_>::end(inFiles);
  bVar2 = __gnu_cxx::operator!=
                    (&local_88,
                     (__normal_iterator<_IO_FILE_**,_std::vector<_IO_FILE_*,_std::allocator<_IO_FILE_*>_>_>
                      *)(row.data + 0xff8));
  if (!bVar2) {
    if (bVar1) {
      GetPLTRow = GetRowLegacy;
      local_10d0 = GetRowLegacy;
    }
    else {
      GetPLTRow = GetRowORD;
      local_10d0 = GetRowORD;
    }
    sVar4 = std::
            map<int,_kat::fin_data,_std::less<int>,_std::allocator<std::pair<const_int,_kat::fin_data>_>_>
            ::size((map<int,_kat::fin_data,_std::less<int>,_std::allocator<std::pair<const_int,_kat::fin_data>_>_>
                    *)&data_plt._M_t._M_impl.super__Rb_tree_header._M_node_count);
    if (sVar4 == 0) {
      sVar5 = std::
              map<kat::period_event,_kat::fin_data,_std::less<kat::period_event>,_std::allocator<std::pair<const_kat::period_event,_kat::fin_data>_>_>
              ::size((map<kat::period_event,_kat::fin_data,_std::less<kat::period_event>,_std::allocator<std::pair<const_kat::period_event,_kat::fin_data>_>_>
                      *)local_70);
      if (sVar5 != 0) {
        WriteAndReadRows<std::map<kat::period_event,kat::fin_data,std::less<kat::period_event>,std::allocator<std::pair<kat::period_event_const,kat::fin_data>>>>
                  ((map<kat::period_event,_kat::fin_data,_std::less<kat::period_event>,_std::allocator<std::pair<const_kat::period_event,_kat::fin_data>_>_>
                    *)local_70,&local_10d0);
      }
    }
    else {
      WriteAndReadRows<std::map<int,kat::fin_data,std::less<int>,std::allocator<std::pair<int_const,kat::fin_data>>>>
                ((map<int,_kat::fin_data,_std::less<int>,_std::allocator<std::pair<const_int,_kat::fin_data>_>_>
                  *)&data_plt._M_t._M_impl.super__Rb_tree_header._M_node_count,
                 (_func_void_map<int,_kat::fin_data,_std::less<int>,_std::allocator<std::pair<const_int,_kat::fin_data>_>_>_ptr_fin_data_ptr
                  **)&GetPLTRow);
    }
    std::
    map<kat::period_event,_kat::fin_data,_std::less<kat::period_event>,_std::allocator<std::pair<const_kat::period_event,_kat::fin_data>_>_>
    ::~map((map<kat::period_event,_kat::fin_data,_std::less<kat::period_event>,_std::allocator<std::pair<const_kat::period_event,_kat::fin_data>_>_>
            *)local_70);
    std::
    map<int,_kat::fin_data,_std::less<int>,_std::allocator<std::pair<const_int,_kat::fin_data>_>_>::
    ~map((map<int,_kat::fin_data,_std::less<int>,_std::allocator<std::pair<const_int,_kat::fin_data>_>_>
          *)&data_plt._M_t._M_impl.super__Rb_tree_header._M_node_count);
    return;
  }
  data._0_4_ = 0;
  while( true ) {
    pp_Var3 = __gnu_cxx::
              __normal_iterator<_IO_FILE_**,_std::vector<_IO_FILE_*,_std::allocator<_IO_FILE_*>_>_>
              ::operator*(&local_88);
    local_10a8 = fgets((char *)&row,0x1000,(FILE *)*pp_Var3);
    if (local_10a8 == (char *)0x0) break;
    pp_Var3 = __gnu_cxx::
              __normal_iterator<_IO_FILE_**,_std::vector<_IO_FILE_*,_std::allocator<_IO_FILE_*>_>_>
              ::operator*(&local_88);
    _inArgs = *pp_Var3;
    GetELTRow._4_4_ = 0;
    data._4_4_ = __isoc99_sscanf(local_10a8,"%f%n",local_10b8,(long)&GetELTRow + 4);
    if (data._4_4_ != 0) goto LAB_00102919;
    fprintf(_stdout,"%s",local_10a8);
  }
  goto LAB_00102af9;
LAB_00102919:
  while (data._4_4_ == 1) {
    data._0_4_ = (int)data + 1;
    local_10a8 = local_10a8 + GetELTRow._4_4_;
    data._4_4_ = __isoc99_sscanf(local_10a8,",%f%n",local_10b8,(long)&GetELTRow + 4);
  }
  if (qpltMELTMask == 0) {
    qpltMELTMask = (int)data;
  }
  else if ((int)data != qpltMELTMask) {
    fprintf(_stderr,"FATAL: File formats do not match.\n");
    exit(1);
  }
  switch((int)data) {
  case 4:
  case 5:
    GetRowORD((map<int,_kat::fin_data,_std::less<int>,_std::allocator<std::pair<const_int,_kat::fin_data>_>_>
               *)&data_plt._M_t._M_impl.super__Rb_tree_header._M_node_count,(fin_data *)&inArgs);
    break;
  case 6:
    GetRowLegacy((map<int,_kat::fin_data,_std::less<int>,_std::allocator<std::pair<const_int,_kat::fin_data>_>_>
                  *)&data_plt._M_t._M_impl.super__Rb_tree_header._M_node_count,(fin_data *)&inArgs);
    bVar1 = true;
    break;
  default:
    fprintf(_stderr,"FATAL: Unknown file format:\n%s",&row);
    exit(1);
  case 8:
  case 10:
    GetRowLegacy((map<kat::period_event,_kat::fin_data,_std::less<kat::period_event>,_std::allocator<std::pair<const_kat::period_event,_kat::fin_data>_>_>
                  *)local_70,(fin_data *)&inArgs);
    bVar1 = true;
    break;
  case 0xb:
    bVar2 = CheckQPLT((char *)&row);
    if (bVar2) {
      GetRowORD((map<kat::period_event,_kat::fin_data,_std::less<kat::period_event>,_std::allocator<std::pair<const_kat::period_event,_kat::fin_data>_>_>
                 *)local_70,(fin_data *)&inArgs);
      it._M_current._0_4_ = (uint)it._M_current | 2;
    }
    else {
      GetRowORD((map<int,_kat::fin_data,_std::less<int>,_std::allocator<std::pair<const_int,_kat::fin_data>_>_>
                 *)&data_plt._M_t._M_impl.super__Rb_tree_header._M_node_count,(fin_data *)&inArgs);
      it._M_current._0_4_ = (uint)it._M_current | 1;
    }
    if ((uint)it._M_current == 3) {
      fprintf(_stderr,"FATAL: Cannot combine QPLT and MELT files\n");
      exit(1);
    }
    break;
  case 0xc:
  case 0x11:
    GetRowORD((map<kat::period_event,_kat::fin_data,_std::less<kat::period_event>,_std::allocator<std::pair<const_kat::period_event,_kat::fin_data>_>_>
               *)local_70,(fin_data *)&inArgs);
  }
LAB_00102af9:
  __gnu_cxx::__normal_iterator<_IO_FILE_**,_std::vector<_IO_FILE_*,_std::allocator<_IO_FILE_*>_>_>::
  operator++(&local_88);
  goto LAB_001027f7;
}

Assistant:

void DoKatSort(std::vector<FILE*>& inFiles) {

		std::map<int, fin_data> data_elt;
		std::map<period_event, fin_data> data_plt;
		int expectedNArgs = 0;
		bool legacyFiles = false;
		// Use these to check that a combination of QPLT and MELT files
		// have not been entered for concatenation
		const int qpltMELTMask = 1 << 1 | 1;   // = 3
		int qpltMELTCheck = 0;

		// Get first line from each file, check for header and
		// determine table type
		for (std::vector<FILE*>::iterator it = inFiles.begin();
		     it != inFiles.end(); ++it) {

			fin_data row;
			int argCheck;
			int inArgs = 0;
			do {

				char *data = fgets(row.data, sizeof(row.data),
						   *it);
				if (data == nullptr) break;   // Empty file
				row.fin = *it;

				float val;
				int offset = 0;
				argCheck = sscanf(data, "%f%n", &val, &offset);
				if (argCheck == 0) {   // Found header
					fprintf(stdout, "%s", data);
					continue;
				}

				// Use number of fields to determine table type
				while (argCheck == 1) {
					inArgs++;
					data += offset;
					argCheck = sscanf(data, ",%f%n", &val,
							  &offset);
				}

				if (expectedNArgs == 0) expectedNArgs = inArgs;
				else if (inArgs != expectedNArgs) {
					fprintf(stderr,
						"FATAL: File formats do not match.\n");
					exit(EXIT_FAILURE);
				}

				switch (inArgs) {
					case number_of_fields::QELT:
					case number_of_fields::SELT:
						GetRowORD(data_elt, row);
						break;
					case number_of_fields::SPLT:
					case number_of_fields::MPLT:
						GetRowORD(data_plt, row);
						break;
					// As number of fields in MELT and QPLT
					// are identical, a further check must
					// be performed
					case number_of_fields::QPLT:
						if (CheckQPLT(row.data)) {
							GetRowORD(data_plt, row);
							qpltMELTCheck |= (1 << 1);
						} else {
							GetRowORD(data_elt, row);
							qpltMELTCheck |= 1;
						}
						if (qpltMELTCheck == qpltMELTMask) {
							fprintf(stderr,
								"FATAL: Cannot combine QPLT and MELT files\n");
							exit(EXIT_FAILURE);
						}
						break;
					case number_of_fields::LegacyELT:
						GetRowLegacy(data_elt, row);
						legacyFiles = true;
						break;
					case number_of_fields::LegacyPLT1:
					case number_of_fields::LegacyPLT2:
						GetRowLegacy(data_plt, row);
						legacyFiles = true;
						break;
					default:
						fprintf(stderr,
							"FATAL: Unknown file format:\n%s",
							row.data);
						exit(EXIT_FAILURE);
				}

				break;

			} while (true);

		}

		void (*GetELTRow)(std::map<int, fin_data>&, const fin_data&);
		void (*GetPLTRow)(std::map<period_event, fin_data>&, const fin_data&);
		if (legacyFiles) {
			GetELTRow = &GetRowLegacy;
			GetPLTRow = &GetRowLegacy;
		} else {
			GetELTRow = &GetRowORD;
			GetPLTRow = &GetRowORD;
		}
		// First entry should always have lowest event ID
		// Only one of data_elt and data_plt will actually have entries
		// so exploit this with a single check
		if (data_elt.size() > 0) WriteAndReadRows(data_elt, GetELTRow);
		else if (data_plt.size() > 0) WriteAndReadRows(data_plt, GetPLTRow);

	}